

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

void __thiscall CVmObjVector::CVmObjVector(CVmObjVector *this,size_t element_count)

{
  char *pcVar1;
  
  (this->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_00326ab8;
  alloc_vector(this,element_count);
  pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  return;
}

Assistant:

CVmObjVector::CVmObjVector(VMG_ size_t element_count)
{
    /* allocate space */
    alloc_vector(vmg_ element_count);

    /* 
     *   a vector intially has no elements in use; the element_count
     *   merely gives the number of slots to be allocated initially (this
     *   won't affect the allocation count, which is stored separately) 
     */
    set_element_count(0);
}